

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::close85(Fl_PostScript_Graphics_Driver *this,void *data)

{
  uchar *chars5;
  int iVar1;
  
  iVar1 = *(int *)((long)data + 4);
  if ((long)iVar1 != 0) {
    if (iVar1 < 4) {
      memset((void *)((long)iVar1 + (long)data),0,(ulong)(3 - iVar1) + 1);
    }
    chars5 = (uchar *)((long)data + 0xc);
    iVar1 = convert85((uchar *)data,chars5);
    if (iVar1 == 1) {
      *(undefined1 *)((long)data + 0x10) = 0x21;
      builtin_memcpy(chars5,"!!!!",4);
    }
    fwrite(chars5,(long)*(int *)((long)data + 4) + 1,1,(FILE *)this->output);
  }
  fputs("~>",(FILE *)this->output);
  operator_delete(data,0x14);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::close85(void *data)  // stops ASCII85-encoding after processing remaining unencoded input bytes, if any
{
  struct85 *big = (struct85 *)data;
  int l;
  if (big->l4) { // # of remaining unencoded input bytes
    l = big->l4;
    while (l < 4) big->bytes4[l++] = 0; // complete them with 0s
    l = convert85(big->bytes4, big->chars5); // encode them
    if (l == 1) memset(big->chars5, '!', 5);
    fwrite(big->chars5, big->l4 + 1, 1, output);
  }
  fputs("~>", output); // write EOD mark
  delete big;
}